

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O2

vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *
puppup::movegen::genFromBoard
          (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
           *__return_storage_ptr__,Gaddag *gaddag,bool param_3)

{
  char cVar1;
  idx cursor;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  pointer pMVar28;
  bool bVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  idx i;
  long lVar35;
  long r;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  long in_stack_00000058;
  long in_stack_00000060;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  long in_stack_00000080;
  long in_stack_00000088;
  long in_stack_00000090;
  long in_stack_00000098;
  long in_stack_000000a0;
  long in_stack_000000a8;
  long in_stack_000000b0;
  long in_stack_000000b8;
  long in_stack_000000c0;
  long in_stack_000000c8;
  long in_stack_000000d0;
  long in_stack_000000d8;
  long in_stack_000000e0;
  long in_stack_000000e8;
  long in_stack_000000f0;
  long in_stack_000000f8;
  long in_stack_00000100;
  State *in_stack_fffffffffffddc38;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> outputs;
  long lStack_22258;
  undefined8 uStack_22250;
  array<bool,_256UL> buildable;
  Rack RStack_22148;
  State SStack_22040;
  State SStack_21038;
  array<long,_16384UL> orthogonal_memo;
  
  std::array<bool,_256UL>::fill(&buildable,(value_type_conflict1 *)&orthogonal_memo);
  for (lVar30 = 0; lVar30 != 0xf0; lVar30 = lVar30 + 1) {
    if (*(long *)(&stack0x00000110 + lVar30 * 8) != 0x1b) {
      buildable._M_elems[lVar30 + -0x10] = true;
      buildable._M_elems[lVar30 + 0x10] = true;
      buildable._M_elems[lVar30 + -1] = true;
      buildable._M_elems[lVar30 + 1] = true;
    }
  }
  for (lVar30 = 0; lVar30 != 0xf0; lVar30 = lVar30 + 1) {
    if ((*(long *)(&stack0x00000110 + lVar30 * 8) != 0x1b) ||
       (bVar29 = __impl::edge(lVar30), bVar29)) {
      buildable._M_elems[lVar30] = false;
    }
  }
  lVar34 = 0;
  outputs.super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  SStack_22040.score = 0x1000000001;
  lVar30 = 0;
  do {
    pMVar28 = outputs.
              super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar27 = in_stack_000000f0;
    lVar26 = in_stack_000000e8;
    lVar25 = in_stack_000000e0;
    lVar24 = in_stack_000000d8;
    lVar23 = in_stack_000000d0;
    lVar22 = in_stack_000000c8;
    lVar21 = in_stack_000000c0;
    lVar20 = in_stack_000000b8;
    lVar19 = in_stack_000000b0;
    lVar18 = in_stack_000000a8;
    lVar17 = in_stack_000000a0;
    lVar16 = in_stack_00000098;
    lVar15 = in_stack_00000090;
    lVar14 = in_stack_00000088;
    lVar13 = in_stack_00000080;
    lVar12 = in_stack_00000078;
    lVar11 = in_stack_00000070;
    lVar10 = in_stack_00000068;
    lVar9 = in_stack_00000060;
    lVar8 = in_stack_00000058;
    lVar7 = in_stack_00000050;
    lVar6 = in_stack_00000048;
    lVar5 = in_stack_00000040;
    lVar4 = in_stack_00000038;
    lVar3 = in_stack_00000030;
    lVar2 = in_stack_00000028;
    lVar32 = in_stack_00000020;
    lVar33 = in_stack_00000018;
    lVar35 = in_stack_00000010;
    lVar31 = r;
    if (lVar30 == 8) {
      if (lVar34 == 0) {
        lStack_22258 = in_stack_000000f8;
        uStack_22250 = in_stack_00000100;
        board::State::State(&SStack_21038);
        memcpy(&SStack_22040,&SStack_21038,0x1008);
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        RStack_22148._M_elems[0] = lVar31;
        RStack_22148._M_elems[1] = lVar35;
        RStack_22148._M_elems[2] = lVar33;
        RStack_22148._M_elems[3] = lVar32;
        RStack_22148._M_elems[4] = lVar2;
        RStack_22148._M_elems[5] = lVar3;
        RStack_22148._M_elems[6] = lVar4;
        RStack_22148._M_elems[7] = lVar5;
        RStack_22148._M_elems[8] = lVar6;
        RStack_22148._M_elems[9] = lVar7;
        RStack_22148._M_elems[10] = lVar8;
        RStack_22148._M_elems[0xb] = lVar9;
        RStack_22148._M_elems[0xc] = lVar10;
        RStack_22148._M_elems[0xd] = lVar11;
        RStack_22148._M_elems[0xe] = lVar12;
        RStack_22148._M_elems[0xf] = lVar13;
        RStack_22148._M_elems[0x10] = lVar14;
        RStack_22148._M_elems[0x11] = lVar15;
        RStack_22148._M_elems[0x12] = lVar16;
        RStack_22148._M_elems[0x13] = lVar17;
        RStack_22148._M_elems[0x14] = lVar18;
        RStack_22148._M_elems[0x15] = lVar19;
        RStack_22148._M_elems[0x16] = lVar20;
        RStack_22148._M_elems[0x17] = lVar21;
        RStack_22148._M_elems[0x18] = lVar22;
        RStack_22148._M_elems[0x19] = lVar23;
        RStack_22148._M_elems[0x1a] = lVar24;
        RStack_22148._M_elems[0x1b] = lVar25;
        RStack_22148._M_elems[0x1c] = lVar26;
        RStack_22148._M_elems[0x1d] = lVar27;
        RStack_22148._M_elems[0x1e] = lStack_22258;
        RStack_22148._M_elems[0x1f] = uStack_22250;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        constArray<16384l>((idx)in_stack_fffffffffffddc38);
        __impl::gen(&RStack_22148,-1,0x77,0x77,0,gaddag,&SStack_22040,0,0,1,__return_storage_ptr__,
                    false,&orthogonal_memo,0,0);
      }
      else {
        outputs.super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_start =
             outputs.
             super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             outputs.
             super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        outputs.super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
        _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
        (__return_storage_ptr__->
        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = pMVar28;
      }
      std::_Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::
      ~_Vector_base(&outputs.
                     super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
                   );
      return __return_storage_ptr__;
    }
    lVar35 = (long)*(int *)((long)SStack_22040.board._M_elems + lVar30 + -8);
    constArray<16384l>((idx)in_stack_fffffffffffddc38);
    for (lVar31 = 0; lVar31 != 0xf0; lVar31 = lVar31 + 1) {
      if (buildable._M_elems[lVar31] == true) {
        cVar1 = *(char *)((long)&buildable + (lVar31 - lVar35));
        cursor = lVar31 - lVar35;
        while (cVar1 == '\0') {
          bVar29 = __impl::edge(cursor);
          if ((bVar29) || (*(long *)(&stack0x00000110 + cursor * 8) == 0x1b)) {
            lVar33 = 0;
            lVar32 = -lVar35;
            goto LAB_0010aa46;
          }
          cVar1 = buildable._M_elems[cursor];
          cursor = cursor - lVar35;
        }
        lVar33 = (((gaddag->nodes_).
                   super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems[0x1f];
        lVar32 = lVar35;
LAB_0010aa46:
        in_stack_fffffffffffddc38 = (State *)&stack0x00000108;
        __impl::gen((Rack *)&stack0x00000008,lVar32,lVar31,lVar31,lVar33,gaddag,
                    (State *)&stack0x00000108,0,0,1,&outputs,param_3,&orthogonal_memo,0,0);
        lVar34 = lVar34 + 1;
      }
    }
    lVar30 = lVar30 + 4;
  } while( true );
}

Assistant:

inline std::vector<Move> genFromBoard(Rack r, const trie::Gaddag& gaddag,
                                      board::State state,
                                      const bool best_only = false) {
    std::array<bool, 256> buildable;
    buildable.fill(false);
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness) {
            buildable[i - 16] = true;
            buildable[i + 16] = true;
            buildable[i - 1] = true;
            buildable[i + 1] = true;
        }
    }
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness || __impl::edge(i)) {
            buildable[i] = false;
        }
    }

    std::vector<Move> outputs;
    idx n_buildable = 0;
    for (idx step : {1, 16}) {
        auto orthogonal_memo = constArray<256 * 32 * 2>(-2);
        for (idx i = 0; i < 240; ++i) {
            if (buildable[i]) {
                bool needs_both_directions = false;
                // todo: faster method than this ridiculous O(n^3) one
                if (!buildable[i - step]) {
                    needs_both_directions = true;
                    idx j = i - step;
                    while (!__impl::edge(j) && state.board[j] != emptiness) {
                        if (buildable[j]) {
                            needs_both_directions = false;
                            break;
                        }
                        j -= step;
                    }
                }
                // if (step == 1) std::cerr << "left ";
                // if (step == 16) std::cerr << "down ";
                if (needs_both_directions) {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " with both directions" << std::endl;
                    __impl::gen(r, -step, i, i, 0, gaddag, state, 0, 0, 1,
                                outputs, best_only, orthogonal_memo);
                } else {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " in forward directions" << std::endl;
                    __impl::gen(r, step, i, i, gaddag.get(0, trie::rev_marker),
                                gaddag, state, 0, 0, 1, outputs, best_only,
                                orthogonal_memo);
                }
                ++n_buildable;
            }
        }
    }
    if (!n_buildable) {
        return genFromIdx(r, gaddag);
    }
    // std::cerr << "outputs: " << outputs.size() << std::endl;
    return outputs;
}